

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O1

void __thiscall
dxil_spv::CFGNode::
traverse_dominated_blocks<dxil_spv::CFGStructurizer::rewrite_invalid_loop_breaks()::__0>
          (CFGNode *this,UnorderedSet<const_CFGNode_*> *completed,CFGNode *header,
          anon_class_24_3_8fce9826 *op)

{
  pointer ppCVar1;
  CFGStructurizer *pCVar2;
  CFGNode *a;
  bool bVar3;
  size_type sVar4;
  CFGNode *pCVar5;
  anon_class_24_3_8fce9826 *op_00;
  pointer ppCVar6;
  pointer ppCVar7;
  __hashtable *__h;
  CFGNode *node;
  CFGNode *local_58;
  anon_class_24_3_8fce9826 *local_50;
  UnorderedSet<const_CFGNode_*> *local_48;
  pointer local_40;
  CFGNode *local_38;
  
  ppCVar7 = (this->succ).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppCVar6 = (this->succ).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_50 = op;
  local_40 = ppCVar6;
  local_38 = header;
  if (ppCVar7 != ppCVar6) {
    do {
      local_58 = *ppCVar7;
      sVar4 = std::
              _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&completed->_M_h,&local_58);
      if (sVar4 == 0) {
        local_48 = completed;
        std::
        _Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<dxil_spv::CFGNode_const*const&,std::__detail::_AllocNode<dxil_spv::ThreadLocalAllocator<std::__detail::_Hash_node<dxil_spv::CFGNode_const*,false>>>>
                  ((_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)completed,&local_58,&local_48);
        bVar3 = dominates(header,local_58);
        if (((bVar3) && (*local_50->merge != local_58)) &&
           (*local_50->invalid_target == (CFGNode *)0x0)) {
          ppCVar6 = (local_58->succ).
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppCVar1 = (local_58->succ).
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          op_00 = local_50;
          if (ppCVar6 != ppCVar1) {
            pCVar2 = local_50->this;
            do {
              a = *ppCVar6;
              pCVar5 = *op_00->merge;
              if (((a != pCVar5) &&
                  (((pCVar2->reachability_bitset).
                    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start
                    [(ulong)(pCVar2->reachability_stride * a->forward_post_visit_order) +
                     (ulong)(pCVar5->forward_post_visit_order >> 5)] >>
                    (pCVar5->forward_post_visit_order & 0x1f) & 1) == 0)) &&
                 ((pCVar5 = find_common_post_dominator(a,pCVar5), op_00 = local_50,
                  pCVar5 != (CFGNode *)0x0 &&
                  ((pCVar5->pred).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   (pCVar5->pred).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish)))) {
                *local_50->invalid_target = a;
              }
              ppCVar6 = ppCVar6 + 1;
            } while (ppCVar6 != ppCVar1);
          }
          header = local_38;
          traverse_dominated_blocks<dxil_spv::CFGStructurizer::rewrite_invalid_loop_breaks()::__0>
                    (local_58,completed,local_38,op_00);
          ppCVar6 = local_40;
        }
      }
      ppCVar7 = ppCVar7 + 1;
    } while (ppCVar7 != ppCVar6);
  }
  return;
}

Assistant:

void CFGNode::traverse_dominated_blocks(UnorderedSet<const CFGNode *> &completed,
                                        const CFGNode &header, const Op &op) const
{
	for (auto *node : succ)
	{
		bool can_visit = completed.count(node) == 0;
		if (can_visit)
			completed.insert(node);

		if (can_visit && header.dominates(node))
		{
			if (op(node))
				node->traverse_dominated_blocks(completed, header, op);
		}
	}
}